

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteObservations.cpp
# Opt level: O0

string * __thiscall
MADPComponentDiscreteObservations::SoftPrintJointObservationSet_abi_cxx11_
          (MADPComponentDiscreteObservations *this)

{
  bool bVar1;
  ostream *poVar2;
  undefined8 uVar3;
  reference ppJVar4;
  long in_RSI;
  string *in_RDI;
  const_iterator jo_last;
  const_iterator jo_it;
  stringstream ss_1;
  stringstream ss;
  ostream *in_stack_fffffffffffffc58;
  E *in_stack_fffffffffffffc60;
  __normal_iterator<JointObservationDiscrete_*const_*,_std::vector<JointObservationDiscrete_*,_std::allocator<JointObservationDiscrete_*>_>_>
  *in_stack_fffffffffffffc68;
  string local_360 [32];
  JointObservationDiscrete **local_340;
  __normal_iterator<JointObservationDiscrete_*const_*,_std::vector<JointObservationDiscrete_*,_std::allocator<JointObservationDiscrete_*>_>_>
  local_338 [3];
  stringstream local_320 [16];
  ostream local_310 [376];
  stringstream local_198 [16];
  E local_188 [9];
  
  std::__cxx11::stringstream::stringstream(local_198);
  if ((*(byte *)(in_RSI + 8) & 1) == 0) {
    std::__cxx11::stringstream::stringstream(local_320);
    poVar2 = std::operator<<(local_310,
                             "MADPComponentDiscreteObservations::PrintJointObservationSet(");
    poVar2 = std::operator<<(poVar2,") - Error: not initialized. ");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    uVar3 = __cxa_allocate_exception(0x28);
    E::E(in_stack_fffffffffffffc60,(stringstream *)in_stack_fffffffffffffc58);
    __cxa_throw(uVar3,&E::typeinfo,E::~E);
  }
  local_338[0]._M_current =
       (JointObservationDiscrete **)
       std::vector<JointObservationDiscrete_*,_std::allocator<JointObservationDiscrete_*>_>::begin
                 ((vector<JointObservationDiscrete_*,_std::allocator<JointObservationDiscrete_*>_> *
                  )in_stack_fffffffffffffc58);
  local_340 = (JointObservationDiscrete **)
              std::vector<JointObservationDiscrete_*,_std::allocator<JointObservationDiscrete_*>_>::
              end((vector<JointObservationDiscrete_*,_std::allocator<JointObservationDiscrete_*>_> *
                  )in_stack_fffffffffffffc58);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<JointObservationDiscrete_*const_*,_std::vector<JointObservationDiscrete_*,_std::allocator<JointObservationDiscrete_*>_>_>
                        *)in_stack_fffffffffffffc60,
                       (__normal_iterator<JointObservationDiscrete_*const_*,_std::vector<JointObservationDiscrete_*,_std::allocator<JointObservationDiscrete_*>_>_>
                        *)in_stack_fffffffffffffc58);
    if (!bVar1) break;
    in_stack_fffffffffffffc60 = local_188;
    ppJVar4 = __gnu_cxx::
              __normal_iterator<JointObservationDiscrete_*const_*,_std::vector<JointObservationDiscrete_*,_std::allocator<JointObservationDiscrete_*>_>_>
              ::operator*(local_338);
    (*((*ppJVar4)->super_JointObservation)._vptr_JointObservation[3])(local_360);
    in_stack_fffffffffffffc58 = std::operator<<((ostream *)in_stack_fffffffffffffc60,local_360);
    std::ostream::operator<<(in_stack_fffffffffffffc58,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_360);
    __gnu_cxx::
    __normal_iterator<JointObservationDiscrete_*const_*,_std::vector<JointObservationDiscrete_*,_std::allocator<JointObservationDiscrete_*>_>_>
    ::operator++(in_stack_fffffffffffffc68,(int)((ulong)in_stack_fffffffffffffc60 >> 0x20));
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

string MADPComponentDiscreteObservations::SoftPrintJointObservationSet() const
{
    stringstream ss;
    if(!_m_initialized)
    {
    stringstream ss;
        ss << "MADPComponentDiscreteObservations::PrintJointObservationSet("<<
       ") - Error: not initialized. "<<endl;
    throw E(ss);
    }
    vector<JointObservationDiscrete*>::const_iterator jo_it = 
    _m_jointObservationVec.begin();
    vector<JointObservationDiscrete*>::const_iterator jo_last = 
    _m_jointObservationVec.end();
    while(jo_it != jo_last)
    {
        ss << (*jo_it)->SoftPrint()<<endl;
        jo_it++;    
    }
    return(ss.str());
}